

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte *pbVar3;
  bool bVar4;
  stbi_uc sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float *output;
  stbi_uc *psVar9;
  stbi_uc *psVar10;
  long lVar11;
  stbi_uc sVar12;
  int c;
  float *output_00;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  int b;
  stbi_uc sVar16;
  byte bVar17;
  uint a;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  stbi_uc *local_4a8;
  float *local_498;
  stbi_uc *local_490;
  long local_488;
  char *local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  uVar7 = (ulong)(uint)req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar4 = false;
      do {
        auVar20[0] = -(cStack_431 == '3');
        auVar20[1] = -(cStack_430 == '2');
        auVar20[2] = -(cStack_42f == '-');
        auVar20[3] = -(cStack_42e == 'b');
        auVar20[4] = -(cStack_42d == 'i');
        auVar20[5] = -(cStack_42c == 't');
        auVar20[6] = -(cStack_42b == '_');
        auVar20[7] = -(cStack_42a == 'r');
        auVar20[8] = -(cStack_429 == 'l');
        auVar20[9] = -(cStack_428 == 'e');
        auVar20[10] = -(cStack_427 == '_');
        auVar20[0xb] = -(cStack_426 == 'r');
        auVar20[0xc] = -(cStack_425 == 'g');
        auVar20[0xd] = -(cStack_424 == 'b');
        auVar20[0xe] = -(cStack_423 == 'e');
        auVar20[0xf] = -(cStack_422 == '\0');
        auVar21[0] = -(local_438 == 'F');
        auVar21[1] = -(cStack_437 == 'O');
        auVar21[2] = -(cStack_436 == 'R');
        auVar21[3] = -(cStack_435 == 'M');
        auVar21[4] = -(cStack_434 == 'A');
        auVar21[5] = -(cStack_433 == 'T');
        auVar21[6] = -(cStack_432 == '=');
        auVar21[7] = -(cStack_431 == '3');
        auVar21[8] = -(cStack_430 == '2');
        auVar21[9] = -(cStack_42f == '-');
        auVar21[10] = -(cStack_42e == 'b');
        auVar21[0xb] = -(cStack_42d == 'i');
        auVar21[0xc] = -(cStack_42c == 't');
        auVar21[0xd] = -(cStack_42b == '_');
        auVar21[0xe] = -(cStack_42a == 'r');
        auVar21[0xf] = -(cStack_429 == 'l');
        auVar21 = auVar21 & auVar20;
        if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
          bVar4 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
        iVar15 = (int)uVar7;
      } while (local_438 != '\0');
      if (bVar4) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_448 = &cStack_435;
          uVar7 = strtol(local_448,&local_448,10);
          local_448 = local_448 + 2;
          do {
            pcVar13 = local_448;
            local_448 = pcVar13 + 1;
          } while (pcVar13[-2] == ' ');
          if (((pcVar13[-2] == '+') && (pcVar13[-1] == 'X')) && (*pcVar13 == ' ')) {
            uVar8 = strtol(local_448,(char **)0x0,10);
            a = (uint)uVar8;
            *x = a;
            b = (int)uVar7;
            *y = b;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            c = 3;
            if (req_comp != 0) {
              c = req_comp;
            }
            iVar6 = stbi__mad4sizes_valid(a,b,c,(int)x,iVar15);
            if (iVar6 == 0) {
              stbi__g_failure_reason = "too large";
              return (float *)0x0;
            }
            output = (float *)stbi__malloc_mad4(a,b,c,(int)x,iVar15);
            if (output != (float *)0x0) {
              iVar15 = 0;
              if (a - 0x8000 < 0xffff8008) goto LAB_001713a9;
              if (b < 1) {
                return output;
              }
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              uVar19 = 0;
              local_4a8 = (stbi_uc *)0x0;
              local_498 = output;
              while( true ) {
                psVar10 = s->img_buffer;
                psVar9 = s->img_buffer_end;
                if (psVar10 < psVar9) {
                  s->img_buffer = psVar10 + 1;
                  sVar5 = *psVar10;
                  psVar10 = psVar10 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar5 = '\0';
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar5 = '\0';
                    psVar9 = psVar2;
                  }
                  else {
                    sVar5 = *psVar1;
                    psVar9 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar9;
                  s->img_buffer = psVar2;
                  psVar10 = psVar2;
                }
                if (psVar10 < psVar9) {
                  s->img_buffer = psVar10 + 1;
                  sVar12 = *psVar10;
                  psVar10 = psVar10 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar12 = '\0';
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar12 = '\0';
                    psVar9 = psVar2;
                  }
                  else {
                    sVar12 = *psVar1;
                    psVar9 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar9;
                  s->img_buffer = psVar2;
                  psVar10 = psVar2;
                }
                if (psVar10 < psVar9) {
                  s->img_buffer = psVar10 + 1;
                  sVar16 = *psVar10;
                  psVar10 = psVar10 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar16 = '\0';
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar16 = '\0';
                    psVar9 = psVar2;
                  }
                  else {
                    sVar16 = *psVar1;
                    psVar9 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar9;
                  s->img_buffer = psVar2;
                  psVar10 = psVar2;
                }
                if (((sVar5 != '\x02') || (sVar12 != '\x02')) || ((char)sVar16 < '\0')) {
                  local_440 = sVar5;
                  local_43f = sVar12;
                  local_43e = sVar16;
                  local_43d = stbi__get8(s);
                  stbi__hdr_convert(output,&local_440,c);
                  free(local_4a8);
                  iVar15 = 0;
                  iVar6 = 1;
                  do {
                    stbi__getn(s,local_43c,4);
                    stbi__hdr_convert(output + (long)(int)(c * a * iVar15) + (long)(iVar6 * c),
                                      local_43c,c);
                    iVar6 = iVar6 + 1;
                    while ((int)a <= iVar6) {
                      iVar15 = iVar15 + 1;
LAB_001713a9:
                      iVar6 = 0;
                      if (b <= iVar15) {
                        return output;
                      }
                    }
                  } while( true );
                }
                if (psVar10 < psVar9) {
                  s->img_buffer = psVar10 + 1;
                  sVar5 = *psVar10;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar5 = '\0';
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar5 = '\0';
                    psVar10 = psVar2;
                  }
                  else {
                    sVar5 = *psVar1;
                    psVar10 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar10;
                  s->img_buffer = psVar2;
                }
                if (CONCAT11(sVar16,sVar5) != a) {
                  free(output);
                  free(local_4a8);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if ((local_4a8 == (stbi_uc *)0x0) &&
                   (local_4a8 = (stbi_uc *)malloc((ulong)(a * 4)), local_4a8 == (stbi_uc *)0x0))
                break;
                local_488 = 0;
                local_490 = local_4a8;
                do {
                  iVar15 = 0;
                  uVar18 = uVar8 & 0xffffffff;
                  do {
                    pbVar3 = s->img_buffer;
                    psVar10 = s->img_buffer_end;
                    if (pbVar3 < psVar10) {
                      s->img_buffer = pbVar3 + 1;
                      bVar17 = *pbVar3;
                      psVar9 = pbVar3 + 1;
LAB_001710ec:
                      if (bVar17 < 0x81) {
                        uVar14 = (uint)bVar17;
                        if ((uint)uVar18 < uVar14) goto LAB_00171312;
                        if (uVar14 != 0) {
                          lVar11 = 0;
                          do {
                            psVar10 = s->img_buffer;
                            if (psVar10 < s->img_buffer_end) {
                              s->img_buffer = psVar10 + 1;
                              sVar5 = *psVar10;
                            }
                            else if (s->read_from_callbacks == 0) {
                              sVar5 = '\0';
                            }
                            else {
                              iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              if (iVar6 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                sVar5 = '\0';
                                psVar10 = psVar2;
                              }
                              else {
                                sVar5 = *psVar1;
                                psVar10 = psVar1 + iVar6;
                              }
                              s->img_buffer_end = psVar10;
                              s->img_buffer = psVar2;
                            }
                            local_490[lVar11 * 4 + (long)iVar15 * 4] = sVar5;
                            lVar11 = lVar11 + 1;
                          } while (uVar14 != (uint)lVar11);
                          iVar15 = iVar15 + (uint)lVar11;
                        }
                      }
                      else {
                        if (psVar9 < psVar10) {
                          s->img_buffer = psVar9 + 1;
                          sVar5 = *psVar9;
                        }
                        else if (s->read_from_callbacks == 0) {
                          sVar5 = '\0';
                        }
                        else {
                          iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar6 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            sVar5 = '\0';
                            psVar10 = psVar2;
                          }
                          else {
                            sVar5 = *psVar1;
                            psVar10 = psVar1 + iVar6;
                          }
                          s->img_buffer_end = psVar10;
                          s->img_buffer = psVar2;
                        }
                        if ((uint)uVar18 < (bVar17 & 0x7f)) {
LAB_00171312:
                          free(output);
                          free(local_4a8);
                          stbi__g_failure_reason = "corrupt";
                          return (float *)0x0;
                        }
                        if ((bVar17 & 0x7f) != 0) {
                          lVar11 = 0;
                          do {
                            local_490[lVar11 * 4 + (long)iVar15 * 4] = sVar5;
                            lVar11 = lVar11 + 1;
                          } while ((bVar17 & 0x7f) != (uint)lVar11);
                          iVar15 = iVar15 + (uint)lVar11;
                        }
                      }
                    }
                    else if (s->read_from_callbacks != 0) {
                      iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar6 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar17 = 0;
                        psVar10 = psVar2;
                      }
                      else {
                        bVar17 = *psVar1;
                        psVar10 = psVar1 + iVar6;
                      }
                      s->img_buffer_end = psVar10;
                      s->img_buffer = psVar2;
                      psVar9 = psVar2;
                      goto LAB_001710ec;
                    }
                    uVar18 = (ulong)(a - iVar15);
                  } while (a - iVar15 != 0 && iVar15 <= (int)a);
                  local_488 = local_488 + 1;
                  local_490 = local_490 + 1;
                  output_00 = local_498;
                  psVar10 = local_4a8;
                  uVar18 = uVar8 & 0x7fffffff;
                } while (local_488 != 4);
                do {
                  stbi__hdr_convert(output_00,psVar10,c);
                  uVar18 = uVar18 - 1;
                  output_00 = output_00 + c;
                  psVar10 = psVar10 + 4;
                } while (uVar18 != 0);
                uVar19 = uVar19 + 1;
                local_498 = local_498 + (uVar8 & 0xffffffff) * (long)c;
                if (uVar19 == (uVar7 & 0x7fffffff)) {
                  free(local_4a8);
                  return output;
                }
              }
              free(output);
            }
            stbi__g_failure_reason = "outofmem";
            return (float *)0x0;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}